

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

StrScanFmt strscan_oct(uint8_t *p,TValue *o,StrScanFmt fmt,int32_t neg,uint32_t dig)

{
  uint64_t local_48;
  uint local_40;
  ulong local_38;
  uint64_t x;
  uint32_t dig_local;
  int32_t neg_local;
  StrScanFmt fmt_local;
  TValue *o_local;
  uint8_t *p_local;
  
  local_38 = 0;
  if ((0x16 < dig) || ((x._4_4_ = dig, o_local = (TValue *)p, dig == 0x16 && (0x31 < *p)))) {
    return STRSCAN_ERROR;
  }
  while (x._4_4_ != 0) {
    if ((*(byte *)o_local < 0x30) || (0x37 < *(byte *)o_local)) {
      return STRSCAN_ERROR;
    }
    local_38 = local_38 * 8 + (long)(int)(*(byte *)o_local & 7);
    x._4_4_ = x._4_4_ - 1;
    o_local = (TValue *)((long)&(o_local->gcr).gcptr64 + 1);
  }
  dig_local = fmt;
  if (fmt == STRSCAN_INT) {
    if (neg + 0x80000000 <= local_38) {
      dig_local = 4;
    }
  }
  else if (fmt != STRSCAN_U32) {
    if (neg == 0) {
      local_48 = local_38;
    }
    else {
      local_48 = (local_38 ^ 0xffffffffffffffff) + 1;
    }
    o->u64 = local_48;
    return fmt;
  }
  if (local_38 >> 0x20 == 0) {
    local_40 = (uint)local_38;
    if (neg != 0) {
      local_40 = (local_40 ^ 0xffffffff) + 1;
    }
    (o->field_4).i = local_40;
    return dig_local;
  }
  return STRSCAN_ERROR;
}

Assistant:

static StrScanFmt strscan_oct(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, int32_t neg, uint32_t dig)
{
  uint64_t x = 0;

  /* Scan octal digits. */
  if (dig > 22 || (dig == 22 && *p > '1')) return STRSCAN_ERROR;
  while (dig-- > 0) {
    if (!(*p >= '0' && *p <= '7')) return STRSCAN_ERROR;
    x = (x << 3) + (*p++ & 7);
  }

  /* Format-specific handling. */
  switch (fmt) {
  case STRSCAN_INT:
    if (x >= 0x80000000u+neg) fmt = STRSCAN_U32;
    /* fallthrough */
  case STRSCAN_U32:
    if ((x >> 32)) return STRSCAN_ERROR;
    o->i = neg ? (int32_t)(~(uint32_t)x+1u) : (int32_t)x;
    break;
  default:
  case STRSCAN_I64:
  case STRSCAN_U64:
    o->u64 = neg ? ~x+1u : x;
    break;
  }
  return fmt;
}